

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void emit_class_field_init(JSParseState *s)

{
  int label;
  
  emit_op(s,0xb6);
  emit_u32(s,0x76);
  emit_u16(s,(uint16_t)s->cur_func->scope_level);
  emit_op(s,'\x11');
  label = emit_goto(s,0x69,-1);
  emit_op(s,0xb6);
  emit_u32(s,8);
  emit_u16(s,0);
  emit_op(s,'\x1b');
  emit_op(s,'$');
  emit_u16(s,0);
  emit_label(s,label);
  emit_op(s,'\x0e');
  return;
}

Assistant:

static void emit_class_field_init(JSParseState *s)
{
    int label_next;
    
    emit_op(s, OP_scope_get_var);
    emit_atom(s, JS_ATOM_class_fields_init);
    emit_u16(s, s->cur_func->scope_level);

    /* no need to call the class field initializer if not defined */
    emit_op(s, OP_dup);
    label_next = emit_goto(s, OP_if_false, -1);
    
    emit_op(s, OP_scope_get_var);
    emit_atom(s, JS_ATOM_this);
    emit_u16(s, 0);
    
    emit_op(s, OP_swap);
    
    emit_op(s, OP_call_method);
    emit_u16(s, 0);

    emit_label(s, label_next);
    emit_op(s, OP_drop);
}